

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Cues *size_;
  ulong uVar4;
  Cluster **ppCVar5;
  Cluster **ppCVar6;
  Cluster *pCVar7;
  Cues *pCVar8;
  Cues *pCVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char cVar14;
  Cluster **ppCVar15;
  Cues *pCVar16;
  long lVar17;
  int iVar18;
  Cues *unaff_R15;
  bool bVar19;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  long local_78;
  Cues *local_70;
  long local_68;
  Cues *local_60;
  long local_58;
  Cluster **local_50;
  longlong local_48;
  long local_40;
  longlong local_38;
  
  local_50 = pResult;
  iVar3 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_58,&local_78);
  if (iVar3 < 0) {
    return (long)iVar3;
  }
  lVar17 = this->m_start + this->m_size;
  local_60 = (Cues *)0xffffffffffffffff;
  if (this->m_size < 0) {
    lVar17 = -1;
  }
  local_68 = 0;
  do {
    lVar11 = *pos;
    if (-1 < local_58 && local_58 <= lVar11) {
      return 1;
    }
    if (-1 < lVar17 && lVar17 <= lVar11) {
      return 1;
    }
    if (local_78 <= lVar11) {
      *len = 1;
      return -3;
    }
    size_ = (Cues *)GetUIntLength(this->m_pReader,lVar11,len);
    cVar14 = '\x01';
    if (-1 < (long)size_) {
      if (size_ == (Cues *)0x0) {
        if ((-1 < lVar17) && (lVar17 < *len + *pos)) goto LAB_0015e059;
        lVar11 = *pos;
        if (local_78 < *len + lVar11) {
LAB_0015e075:
          size_ = (Cues *)0xfffffffffffffffd;
        }
        else {
          lVar12 = this->m_start;
          size_ = (Cues *)ReadID(this->m_pReader,lVar11,len);
          if (-1 < (long)size_) {
            if (size_ == (Cues *)0x0) {
              size_ = (Cues *)0xffffffffffffffff;
            }
            else {
              lVar10 = *pos + *len;
              *pos = lVar10;
              if (local_78 <= lVar10) {
                *len = 1;
                goto LAB_0015e075;
              }
              local_70 = size_;
              size_ = (Cues *)GetUIntLength(this->m_pReader,lVar10,len);
              if (-1 < (long)size_) {
                if (size_ != (Cues *)0x0) goto LAB_0015e039;
                if ((-1 < lVar17) && (lVar17 < *len + *pos)) goto LAB_0015e059;
                if (local_78 < *len + *pos) goto LAB_0015e075;
                size_ = (Cues *)ReadUInt(this->m_pReader,*pos,len);
                if (-1 < (long)size_) {
                  lVar10 = *len;
                  lVar13 = *pos + lVar10;
                  *pos = lVar13;
                  if (size_ == (Cues *)0x0) {
                    cVar14 = '\x03';
                    size_ = unaff_R15;
                  }
                  else {
                    uVar4 = -1L << ((char)lVar10 * '\a' & 0x3fU) ^ (ulong)size_;
                    lVar10 = (long)&size_->m_pSegment + lVar13;
                    if (((-1 < lVar17) && (uVar4 != 0xffffffffffffffff)) && (lVar17 < lVar10))
                    goto LAB_0015e059;
                    if (local_70 == (Cues *)0x1f43b675) {
                      if (uVar4 != 0xffffffffffffffff) {
                        local_60 = size_;
                      }
                      cVar14 = '\x02';
                      size_ = unaff_R15;
                      local_68 = lVar11 - lVar12;
                    }
                    else {
                      if (local_70 == (Cues *)0x1c53bb6b) {
                        if ((uVar4 != 0xffffffffffffffff) && (lVar17 < 0 || lVar10 <= lVar17)) {
                          if (this->m_pCues == (Cues *)0x0) {
                            local_70 = (Cues *)lVar10;
                            local_48 = lVar13;
                            pCVar8 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                            if (pCVar8 == (Cues *)0x0) {
                              local_70 = (Cues *)0x0;
                            }
                            else {
                              lVar12 = (long)local_70 - lVar11;
                              local_70 = pCVar8;
                              Cues::Cues(pCVar8,this,local_48,(longlong)size_,lVar11,lVar12);
                            }
                            this->m_pCues = local_70;
                            if (local_70 == (Cues *)0x0) {
                              size_ = (Cues *)0x0;
                              goto LAB_0015e209;
                            }
                          }
                          bVar2 = -1 < lVar17;
                          lVar11 = (long)&size_->m_pSegment + *pos;
                          *pos = lVar11;
                          bVar19 = lVar17 < lVar11;
LAB_0015e2ae:
                          cVar14 = (bVar19 & bVar2 ^ 1U) * '\x02' + '\x01';
                          size_ = unaff_R15;
                          if ((bVar19 & bVar2) != 0) {
                            size_ = (Cues *)0xfffffffffffffffe;
                          }
                          goto LAB_0015e209;
                        }
                      }
                      else if (uVar4 != 0xffffffffffffffff) {
                        bVar2 = lVar17 < lVar10;
                        bVar19 = -1 < lVar17;
                        *pos = lVar10;
                        goto LAB_0015e2ae;
                      }
LAB_0015e059:
                      size_ = (Cues *)0xfffffffffffffffe;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_0015e039:
        size_ = (Cues *)0xfffffffffffffffd;
      }
    }
LAB_0015e209:
    unaff_R15 = size_;
  } while (cVar14 == '\x03');
  if (cVar14 != '\x02') {
    return (long)size_;
  }
  ppCVar15 = this->m_clusters + this->m_clusterCount;
  ppCVar5 = ppCVar15 + this->m_clusterPreloadCount;
  while (ppCVar15 < ppCVar5) {
    ppCVar6 = (Cluster **)
              ((long)ppCVar15 +
              (((long)ppCVar5 - (long)ppCVar15 >> 3) - ((long)ppCVar5 - (long)ppCVar15 >> 0x3f) &
              0xfffffffffffffffeU) * 4);
    pCVar7 = *ppCVar6;
    lVar11 = pCVar7->m_element_start - pCVar7->m_pSegment->m_start;
    *pos = lVar11;
    if (lVar11 < local_68) {
      ppCVar15 = ppCVar6 + 1;
      bVar2 = true;
      ppCVar6 = ppCVar5;
    }
    else {
      bVar2 = true;
      if (lVar11 <= local_68) {
        *local_50 = pCVar7;
        bVar2 = false;
        size_ = (Cues *)0x0;
        ppCVar6 = ppCVar5;
      }
    }
    ppCVar5 = ppCVar6;
    if (!bVar2) {
      return (long)size_;
    }
  }
  lVar11 = Cluster::HasBlockEntries(this,local_68,&local_38,&local_40);
  if (lVar11 < 0) {
    *pos = local_38;
    *len = local_40;
    return lVar11;
  }
  if (lVar11 != 0) {
    pCVar7 = Cluster::Create(this,-1,local_68);
    if (pCVar7 == (Cluster *)0x0) {
      return -1;
    }
    bVar2 = PreloadCluster(this,pCVar7,(long)ppCVar15 - (long)this->m_clusters >> 3);
    if (!bVar2) {
      Cluster::~Cluster(pCVar7);
      operator_delete(pCVar7);
      return -1;
    }
    *local_50 = pCVar7;
    return 0;
  }
  if ((long)local_60 < 0) {
    lVar11 = *pos;
    local_68 = lVar11;
    if ((lVar11 < local_58 || local_58 < 0) && (lVar11 < lVar17 || lVar17 < 0)) {
      do {
        if (local_78 <= lVar11) {
          *len = 1;
          size_ = (Cues *)0xfffffffffffffffd;
          local_60 = (Cues *)0xffffffffffffffff;
          bVar2 = false;
          goto LAB_0015e695;
        }
        pCVar8 = (Cues *)GetUIntLength(this->m_pReader,lVar11,len);
        iVar3 = 1;
        iVar18 = 1;
        if ((long)pCVar8 < 0) {
LAB_0015e4b1:
          iVar18 = iVar3;
          bVar2 = false;
        }
        else {
          pCVar16 = (Cues *)0xfffffffffffffffd;
          iVar1 = 1;
          if (pCVar8 == (Cues *)0x0) {
            if ((lVar17 < 0) || (*len + *pos <= lVar17)) {
              if (*len + *pos <= local_78) {
                pCVar8 = (Cues *)ReadID(this->m_pReader,*pos,len);
                if (-1 < (long)pCVar8) {
                  bVar2 = false;
                  if (pCVar8 == (Cues *)0x1c53bb6b) {
                    pCVar16 = size_;
                    iVar1 = 6;
                    goto LAB_0015e4a2;
                  }
                  if (pCVar8 == (Cues *)0x1f43b675) {
                    iVar18 = 6;
                    pCVar8 = size_;
                    goto LAB_0015e4e7;
                  }
                  lVar11 = *pos + *len;
                  *pos = lVar11;
                  if (local_78 <= lVar11) {
                    *len = 1;
                    goto LAB_0015e4e5;
                  }
                  pCVar9 = (Cues *)GetUIntLength(this->m_pReader,lVar11,len);
                  pCVar8 = pCVar9;
                  if ((-1 < (long)pCVar9) && (pCVar8 = pCVar16, pCVar9 == (Cues *)0x0)) {
                    if ((lVar17 < 0) || (*len + *pos <= lVar17)) {
                      if ((*len + *pos <= local_78) &&
                         (pCVar16 = (Cues *)ReadUInt(this->m_pReader,*pos,len), pCVar8 = pCVar16,
                         -1 < (long)pCVar16)) {
                        lVar11 = *len;
                        lVar12 = *pos + lVar11;
                        *pos = lVar12;
                        if (pCVar16 == (Cues *)0x0) {
                          pCVar8 = size_;
                          iVar3 = 7;
                        }
                        else {
                          pCVar8 = (Cues *)0xfffffffffffffffe;
                          if ((-1L << ((char)lVar11 * '\a' & 0x3fU) ^ (ulong)pCVar16) !=
                              0xffffffffffffffff) {
                            lVar12 = (long)&pCVar16->m_pSegment + lVar12;
                            bVar2 = false;
                            if ((lVar17 < 0) || (lVar12 <= lVar17)) {
                              *pos = lVar12;
                              bVar2 = true;
                              iVar18 = 0;
                              pCVar8 = size_;
                            }
                            goto LAB_0015e4e7;
                          }
                        }
                      }
                    }
                    else {
                      pCVar8 = (Cues *)0xfffffffffffffffe;
                      iVar3 = 1;
                    }
                  }
                }
                goto LAB_0015e4b1;
              }
            }
            else {
              pCVar16 = (Cues *)0xfffffffffffffffe;
            }
LAB_0015e4e5:
            bVar2 = false;
            pCVar8 = pCVar16;
          }
          else {
LAB_0015e4a2:
            iVar18 = iVar1;
            bVar2 = false;
            pCVar8 = pCVar16;
          }
        }
LAB_0015e4e7:
        size_ = pCVar8;
        if ((iVar18 != 0) && (iVar18 != 7)) {
          if (iVar18 != 6) {
            local_60 = (Cues *)0xffffffffffffffff;
            goto LAB_0015e695;
          }
          break;
        }
        lVar11 = *pos;
        if ((local_58 <= lVar11 && -1 < local_58) || (lVar17 <= lVar11 && -1 < lVar17)) break;
      } while( true );
    }
    local_60 = (Cues *)(*pos - local_68);
    *pos = local_68;
    bVar2 = true;
LAB_0015e695:
    if (!bVar2) {
      return (long)size_;
    }
  }
  lVar11 = (long)&local_60->m_pSegment + *pos;
  *pos = lVar11;
  return (ulong)(lVar11 <= lVar17 || lVar17 < 0) * 4 + -2;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}